

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  pointer pdVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  double *it;
  long lVar5;
  double *pdVar6;
  initializer_list<double> __l;
  string buf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> out3;
  string out2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out5;
  vector<double,_std::allocator<double>_> dout5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out4;
  string out1;
  string buf;
  string dout1;
  string brand;
  vector<double,_std::allocator<double>_> buf2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dout4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dout3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e1;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> e2;
  string words [4];
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> d2;
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  char *local_298;
  long local_290;
  char local_288;
  undefined7 uStack_287;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  undefined8 uStack_260;
  vector<double,_std::allocator<double>_> local_258;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  long local_200;
  long local_1f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long *local_1c8;
  size_t local_1c0;
  long local_1b8 [2];
  vector<double,_std::allocator<double>_> local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  char *local_178;
  long local_170;
  long local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  long *local_98 [2];
  long local_88 [3];
  base64_state local_70;
  undefined8 local_60;
  Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_58
  ;
  decode_state local_40;
  
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"YukiWorkshop","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_128.output_target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  base64_stream_encode_init(&local_128.b64_state,0);
  local_128.output_target = &local_228;
  YukiWorkshop::Base64X::__encode_to_target
            (&local_128,local_128.output_target,(char *)local_1c8,local_1c0);
  YukiWorkshop::Base64X::__encode_to_target(&local_128,local_128.output_target," ",1);
  YukiWorkshop::Base64X::__encode_to_target(&local_128,local_128.output_target,"Rocks!",6);
  YukiWorkshop::Base64X::__finalize(&local_128,local_128.output_target);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_58.output_target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  base64_stream_decode_init(&local_58.b64_state,0);
  local_58.output_target = &local_1e8;
  YukiWorkshop::Base64X::__decode_to_target
            (&local_58,local_58.output_target,local_228._M_dataplus._M_p,local_228._M_string_length)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  local_208._M_current = (char *)local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Austin!","");
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_140,local_208,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_208._M_current + local_200),(allocator_type *)&local_f8);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Hey ","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"guys, ","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"this is ","");
  plVar3 = local_88;
  local_98[1] = (long *)0x0;
  local_88[0]._0_1_ = 0;
  local_298 = &local_288;
  local_290 = 0;
  local_288 = '\0';
  local_110.output_target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_98[0] = plVar3;
  base64_stream_encode_init(&local_110.b64_state,0);
  lVar4 = 0;
  do {
    YukiWorkshop::Base64X::Encoder<std::__cxx11::string>::encode<std::__cxx11::string>
              (&local_2d8,&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&local_f8._M_dataplus._M_p + lVar4));
    std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_2d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x80);
  YukiWorkshop::Base64X::Encoder<std::__cxx11::string>::
  encode<unsigned_char,std::allocator<unsigned_char>>(&local_2d8,&local_110,&local_140);
  std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_2d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  YukiWorkshop::Base64X::
  Encoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  finalize(&local_2d8,&local_110);
  std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_2d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298,local_290);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  local_60 = 0;
  base64_stream_decode_init(&local_70,0);
  lVar4 = local_290;
  if (local_290 != 0) {
    lVar5 = 0;
    do {
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      local_2d8._M_string_length = 0;
      local_2d8.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::push_back((char)&local_2d8);
      YukiWorkshop::Base64X::Decoder<std::__cxx11::string>::decode<std::__cxx11::string>
                (&local_2b8,&local_70,&local_2d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                 local_2d8.field_2._M_local_buf[0]) + 1);
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"roses are red","");
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_178,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_2d8._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_2d8._M_dataplus._M_p + local_2d8._M_string_length),
             (allocator_type *)&local_2b8);
  local_160._M_string_length = local_170 - (long)local_178;
  local_160._M_dataplus._M_p = local_178;
  YukiWorkshop::Base64X::encode_state::as<std::__cxx11::string>
            (&local_2b8,(encode_state *)&local_160);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  local_160._0_16_ = YukiWorkshop::Base64X::encode("violets are blue");
  YukiWorkshop::Base64X::encode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_240,(encode_state *)&local_160);
  fwrite(local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,_stdout);
  fputc(10,_stdout);
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2b8._M_dataplus._M_p;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2b8._M_string_length;
  YukiWorkshop::Base64X::decode_state::as<std::__cxx11::string>
            (&local_160,(decode_state *)&local_278);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  YukiWorkshop::Base64X::decode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_190,(decode_state *)&local_278);
  fwrite(local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,_stdout);
  fputc(10,_stdout);
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x406d2774bc6a7efa;
  uStack_260 = 0x4084d553f7ced917;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400921fb54437efe;
  local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x404535c28f5c28f6;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_278;
  std::vector<double,_std::allocator<double>_>::vector(&local_1a8,__l,(allocator_type *)&local_258);
  local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
  local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  YukiWorkshop::Base64X::encode_state::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_278,(encode_state *)&local_258);
  fwrite(local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,1,
         (long)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,_stdout);
  fputc(10,_stdout);
  local_40.len_ =
       (long)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40.buf_ =
       (char *)local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  YukiWorkshop::Base64X::decode_state::as_vector<double,std::allocator<double>>
            (&local_258,&local_40);
  pdVar1 = local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar6 = local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar6 != pdVar1; pdVar6 = pdVar6 + 1) {
    poVar2 = std::ostream::_M_insert<double>(*pdVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((encode_state *)local_160._M_dataplus._M_p != (encode_state *)&local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != (char *)0x0) {
    operator_delete(local_178,local_168 - (long)local_178);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
  }
  lVar4 = -0x80;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  if (local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((long *)local_208._M_current != local_1f8) {
    operator_delete(local_208._M_current,local_1f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
	// Example 1
	// Encode
	std::string brand = "YukiWorkshop";
	std::string out1;
	Base64X::Encoder<std::string> e1;
	e1 >> out1;
	e1 << brand << " " << "Rocks!" << nullptr;
	std::cout << out1 << "\n";

	// Decode
	std::string dout1;
	Base64X::Decoder<std::string> d1;
	d1 >> dout1;
	d1 << out1;
	std::cout << dout1 << "\n";


	// Example 2
	// Encode
	std::string buf = "Austin!";
	std::vector<uint8_t> v(buf.begin(), buf.end());
	std::string words[4] = { "Hey ", "guys, ", "this is "};
	std::string out2;
	Base64X::Encoder<std::string> e2;
	for (auto &word : words) {
		out2 += e2.encode(word);
	}
	out2 += e2.encode(v);
	out2 += e2.finalize();
	std::cout << out2 << "\n";

	// Decode
	Base64X::Decoder<std::string> d2;
	for (auto &it : out2) {
		std::string c;
		c.push_back(it);
		std::cout << d2.decode(c);
	}
	std::cout << "\n";

	// Example 3
	// Encode
	std::string buf0 = "roses are red";
	std::vector<uint8_t> buf1(buf0.begin(), buf0.end());
	auto out3 = Base64X::encode(buf1).as<std::string>();
	std::cout << out3 << "\n";

	auto out4 = Base64X::encode("violets are blue").as<std::vector<uint8_t>>();
	fwrite(out4.data(), 1, out4.size(), stdout);
	fputc('\n', stdout);

	// Decode
	auto dout3 = Base64X::decode(out3).as<std::string>();
	std::cout << dout3 << "\n";
	auto dout4 = Base64X::decode(out4).as<std::vector<uint8_t>>();
	fwrite(dout4.data(), 1, dout4.size(), stdout);
	fputc('\n', stdout);


	// Example 4
	// Encode
	std::vector<double> buf2 = {3.14159265357, 42.42, 233.233, 666.666};
	auto out5 = Base64X::encode(buf2).as<std::vector<uint8_t>>();
	fwrite(out5.data(), 1, out5.size(), stdout);
	fputc('\n', stdout);

	// Decode
	auto dout5 = Base64X::decode(out5).as_vector<double>();
	for (auto &it : dout5) {
		std::cout << it << " ";
	}
	std::cout << "\n";


}